

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>::
operator()(CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>
           *this,_func_void_String_ptr_size_t *deleter,String *data,size_t size)

{
  size_t sVar1;
  long lVar2;
  
  if (deleter != (_func_void_String_ptr_size_t *)0x0) {
    (*deleter)(data,size);
    return;
  }
  if (data != (String *)0x0) {
    sVar1 = data[-1].field_0._large.size;
    if (sVar1 != 0) {
      lVar2 = sVar1 * 0x18;
      do {
        Containers::String::~String((String *)((long)&data[-1].field_0 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0);
    }
    operator_delete__((void *)((long)&data[-1].field_0 + 0x10));
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }